

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O0

UniqueId * __thiscall
COLLADASaxFWL::IFilePartLoader::createUniqueIdFromId
          (IFilePartLoader *this,ParserChar *colladaId,ClassId classId)

{
  undefined4 uVar1;
  UniqueId *pUVar2;
  URI *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  UniqueId *in_RDI;
  URI uri;
  UniqueId *createdUniqueId;
  undefined8 in_stack_fffffffffffffe40;
  IFilePartLoader *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  allocator<char> in_stack_fffffffffffffe7f;
  String *in_stack_fffffffffffffe80;
  URI *in_stack_fffffffffffffe88;
  URI *in_stack_fffffffffffffe90;
  allocator<char> local_149;
  string local_148 [32];
  string local_128 [115];
  undefined1 in_stack_ffffffffffffff4b;
  ClassId in_stack_ffffffffffffff4c;
  URI *in_stack_ffffffffffffff50;
  IFilePartLoader *in_stack_ffffffffffffff58;
  
  if ((in_RDX == (URI *)0x0) || ((in_RDX->mUriString)._M_dataplus == (_Alloc_hider)0x0)) {
    createUniqueId(in_stack_fffffffffffffe48,(ClassId)((ulong)in_stack_fffffffffffffe40 >> 0x20));
  }
  else {
    (**(code **)(*(long *)in_RSI + 0x58))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,
               (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
               (allocator<char> *)in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe80,
               (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
               (allocator<char> *)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe7f,
                            CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),in_RSI);
    COLLADABU::URI::URI(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    pUVar2 = createUniqueIdFromUrl
                       (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff4c,(bool)in_stack_ffffffffffffff4b);
    uVar1 = *(undefined4 *)&pUVar2->field_0x4;
    in_RDI->mClassId = pUVar2->mClassId;
    *(undefined4 *)&in_RDI->field_0x4 = uVar1;
    in_RDI->mObjectId = pUVar2->mObjectId;
    in_RDI->mFileId = pUVar2->mFileId;
    COLLADABU::URI::~URI(in_RDX);
  }
  return in_RDI;
}

Assistant:

COLLADAFW::UniqueId IFilePartLoader::createUniqueIdFromId( const ParserChar* colladaId, COLLADAFW::ClassId classId )
	{
		COLLADABU_ASSERT( getColladaLoader() );

		if ( !colladaId || !(*colladaId) )
			return createUniqueId(classId);

		COLLADABU::URI uri(getFileUri(), String("#") + String((const char *)colladaId));

		COLLADAFW::UniqueId createdUniqueId = createUniqueIdFromUrl(uri, classId, true);
		return createdUniqueId;
	}